

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value,CoordinateOrder *coordinateOrder,allocator_type *allocator
          )

{
  uchar uVar1;
  unsigned_long *puVar2;
  pointer data;
  runtime_error *this_00;
  ulong uVar3;
  ulong uVar4;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<unsigned_char,std::allocator<unsigned_long>>)0x1;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  uVar4 = 1;
  puVar2 = begin;
  if (begin == end) {
LAB_001039f9:
    data = (pointer)operator_new(uVar4);
    View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin,end,data,
               coordinateOrder,coordinateOrder,allocator);
    uVar1 = *value;
    uVar3 = 0;
    do {
      *(uchar *)(*(long *)this + uVar3) = uVar1;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    if (this[0x3c] != (Marray<unsigned_char,std::allocator<unsigned_long>>)0x0) {
      return;
    }
  }
  else {
    do {
      uVar4 = uVar4 * *puVar2;
      puVar2 = puVar2 + 1;
    } while (puVar2 != end);
    if (uVar4 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
      goto LAB_00103a91;
    }
    if (-1 < (long)uVar4) goto LAB_001039f9;
    std::__throw_bad_alloc();
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00103a91:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}